

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O3

void Pdr_OblDeref(Pdr_Obl_t *p)

{
  int *piVar1;
  Pdr_Set_t *__ptr;
  
  piVar1 = &p->nRefs;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  if (p->pNext != (Pdr_Obl_t *)0x0) {
    Pdr_OblDeref(p->pNext);
  }
  __ptr = p->pState;
  piVar1 = &__ptr->nRefs;
  *piVar1 = *piVar1 + -1;
  if (__ptr != (Pdr_Set_t *)0x0 && *piVar1 == 0) {
    free(__ptr);
  }
  free(p);
  return;
}

Assistant:

void Pdr_OblDeref( Pdr_Obl_t * p )
{
    if ( --p->nRefs == 0 )
    {
        if ( p->pNext )
            Pdr_OblDeref( p->pNext );
        Pdr_SetDeref( p->pState );
        ABC_FREE( p );
    }
}